

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O2

int pigpio_command(int pi,int command,int p1,int p2,int rl)

{
  ssize_t sVar1;
  cmdCmd_t cmd;
  
  cmd.field_3.p3 = 0xfffff825;
  if ((uint)pi < 0x20) {
    if (gPiInUse[(uint)pi] != 0) {
      cmd.field_3.p3 = 0;
      cmd.cmd = command;
      cmd.p1 = p1;
      cmd.p2 = p2;
      _pml(pi);
      sVar1 = send(gPigCommand[(uint)pi],&cmd,0x10,0);
      if (sVar1 == 0x10) {
        sVar1 = recv(gPigCommand[(uint)pi],&cmd,0x10,0x100);
        if (sVar1 == 0x10) {
          if (rl != 0) {
            _pmu(pi);
          }
        }
        else {
          _pmu(pi);
          cmd.field_3.p3 = 0xfffff82f;
        }
      }
      else {
        _pmu(pi);
        cmd.field_3.p3 = 0xfffff830;
      }
    }
  }
  return cmd.field_3.p3;
}

Assistant:

static int pigpio_command(int pi, int command, int p1, int p2, int rl)
{
   cmdCmd_t cmd;

   if ((pi < 0) || (pi >= MAX_PI) || !gPiInUse[pi])
      return pigif_unconnected_pi;

   cmd.cmd = command;
   cmd.p1  = p1;
   cmd.p2  = p2;
   cmd.res = 0;

   _pml(pi);

   if (send(gPigCommand[pi], &cmd, sizeof(cmd), 0) != sizeof(cmd))
   {
      _pmu(pi);
      return pigif_bad_send;
   }

   if (recv(gPigCommand[pi], &cmd, sizeof(cmd), MSG_WAITALL) != sizeof(cmd))
   {
      _pmu(pi);
      return pigif_bad_recv;
   }

   if (rl) _pmu(pi);

   return cmd.res;
}